

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  Env *program;
  Lexer *l;
  Parser *this;
  Program *obj;
  Env *in_RCX;
  list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> evalStmts;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buffer_list;
  _List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> local_a0;
  _List_node_base local_80;
  undefined8 local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Welcome to BEESAFE :) REPL v1.0 ");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Type CTRL-D to Exit");
  std::endl<char,std::char_traits<char>>(poVar3);
  program = evaluator::Evaluator::NewEnvironment();
  do {
    std::operator<<((ostream *)&std::cout,">>");
    local_70 = 0;
    local_80._M_next = &local_80;
    local_80._M_prev = &local_80;
    read_lines((istream *)&std::cin,
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_80);
    uVar1 = *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18));
    if ((uVar1 & 2) == 0) {
      join_lines(&local_50,
                 (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_80);
      l = lexer::Lexer::New(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      this = parser::Parser::New(l);
      obj = parser::Parser::parseProgram(this);
      poVar3 = std::operator<<((ostream *)&std::cout,"Parse -> ");
      poVar3 = ast::operator<<(poVar3,obj);
      std::endl<char,std::char_traits<char>>(poVar3);
      bVar2 = parser::Parser::hasErrors(this);
      if (bVar2) {
        parser::Parser::Errors_abi_cxx11_(&local_68,this);
        spitParseErrors(&local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
      }
      else {
        evaluator::Evaluator::evalProgram_abi_cxx11_
                  ((list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                   &local_a0,(Evaluator *)obj,(Program *)program,in_RCX);
        poVar3 = std::operator<<((ostream *)&std::cout,"evaluated statement size: ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"Eval -> ");
        in_RCX = (Env *)local_a0._M_impl._M_node.super__List_node_base._M_next;
        poVar3 = symbols::operator<<(poVar3,(Object *)
                                            (((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_symbols::Object_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_symbols::Object_*>_>_>
                                               *)&(local_a0._M_impl._M_node.super__List_node_base.
                                                  _M_next)->_M_next)->_M_h)._M_before_begin._M_nxt);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::_List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::
        _M_clear(&local_a0);
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"\t");
      randomMessageGen_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,(string *)&local_a0);
      poVar3 = std::operator<<(poVar3,"...");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_80);
  } while ((uVar1 & 2) == 0);
  return 0;
}

Assistant:

int main()
{
    cout << "Welcome to BEESAFE :) REPL v1.0 " << endl;
    cout << "Type CTRL-D to Exit" << endl;
    auto env = Evaluator::NewEnvironment();
    while (true){
        cout << PROMPT;
        list<string> buffer_list;
        read_lines(cin, buffer_list );
        if(cin.eof()){
            cout << "\t" << randomMessageGen() << "..." << endl;
            break;
        }
        auto l = lexer::Lexer::New(join_lines(buffer_list));
        auto p = parser::Parser::New(l);
        auto program = p->parseProgram();
        cout << "Parse -> "<< program << endl;
        if (!p->hasErrors()){
            auto evalStmts = Evaluator::evalProgram(program, env);
            cout << "evaluated statement size: " << evalStmts.size() << endl;
            cout << "Eval -> " << evalStmts.front() << endl;
        }else{
            spitParseErrors(p->Errors());
        }
    }
}